

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O2

time_t boost::filesystem::detail::last_write_time(path *p,error_code *ec)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  stat path_stat;
  
  iVar2 = stat64((p->m_pathname)._M_dataplus._M_p,(stat64 *)&path_stat);
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    piVar3 = __errno_location();
    iVar2 = *piVar3;
  }
  bVar1 = anon_unknown.dwarf_54f5::error(iVar2,p,ec,"boost::filesystem::last_write_time");
  if (bVar1) {
    path_stat.st_mtim.tv_sec = -1;
  }
  return path_stat.st_mtim.tv_sec;
}

Assistant:

BOOST_FILESYSTEM_DECL
  std::time_t last_write_time(const path& p, system::error_code* ec)
  {
#   ifdef BOOST_POSIX_API

    struct stat path_stat;
    if (error(::stat(p.c_str(), &path_stat)!= 0 ? BOOST_ERRNO : 0,
      p, ec, "boost::filesystem::last_write_time"))
        return std::time_t(-1);
    return path_stat.st_mtime;

#   else

    handle_wrapper hw(
      create_file_handle(p.c_str(), 0,
        FILE_SHARE_DELETE | FILE_SHARE_READ | FILE_SHARE_WRITE, 0,
        OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, 0));

    if (error(hw.handle == INVALID_HANDLE_VALUE ? BOOST_ERRNO : 0,
      p, ec, "boost::filesystem::last_write_time"))
        return std::time_t(-1);

    FILETIME lwt;

    if (error(::GetFileTime(hw.handle, 0, 0, &lwt)== 0 ? BOOST_ERRNO : 0,
      p, ec, "boost::filesystem::last_write_time"))
        return std::time_t(-1);

    return to_time_t(lwt);
#   endif
  }